

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

void __thiscall Lodtalk::StackMemory::stackOverflow(StackMemory *this)

{
  StackPage *pSVar1;
  uint8_t *puVar2;
  uint8_t *__src;
  undefined8 *puVar3;
  StackPage *pSVar4;
  uint8_t *puVar5;
  StackFrame previousFrame;
  StackFrame local_38;
  
  local_38.stackPointer = (this->stackFrame).framePointer;
  local_38.framePointer = *(uint8_t **)local_38.stackPointer;
  local_38.stackPointer =
       local_38.stackPointer + ((ulong)(*(uint *)(local_38.stackPointer + -0x10) & 0xff) + 3) * 8;
  pSVar4 = this->currentPage;
  (pSVar4->headFrame).framePointer = local_38.framePointer;
  (pSVar4->headFrame).stackPointer = local_38.stackPointer;
  pSVar4 = allocatePage(this);
  if (pSVar4 == this->currentPage) {
    __assert_fail("nextPage != currentPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0xe0,"void Lodtalk::StackMemory::stackOverflow()");
  }
  puVar5 = pSVar4->stackPageHighest;
  pSVar4->baseFramePointer = puVar5;
  (pSVar4->headFrame).framePointer = (uint8_t *)0x0;
  (pSVar4->headFrame).stackPointer = puVar5;
  pSVar1 = this->currentPage;
  pSVar1->nextPage = pSVar4;
  pSVar4->previousPage = pSVar1;
  puVar2 = (this->stackFrame).framePointer;
  __src = (this->stackFrame).stackPointer;
  puVar5 = puVar5 + -(long)(puVar2 + ((ulong)(*(uint *)(puVar2 + -0x10) & 0xff) * 8 - (long)__src) +
                                     0x18);
  memcpy(puVar5,__src,
         (size_t)(puVar2 + ((ulong)(*(uint *)(puVar2 + -0x10) & 0xff) * 8 - (long)__src) + 0x18));
  (this->stackFrame).framePointer = puVar5 + ((long)puVar2 - (long)__src);
  (this->stackFrame).stackPointer = puVar5;
  puVar5 = puVar5 + ((long)puVar2 - (long)__src);
  puVar5[0] = '\0';
  puVar5[1] = '\0';
  puVar5[2] = '\0';
  puVar5[3] = '\0';
  puVar5[4] = '\0';
  puVar5[5] = '\0';
  puVar5[6] = '\0';
  puVar5[7] = '\0';
  this->currentPage = pSVar4;
  puVar5 = (this->stackFrame).stackPointer;
  (pSVar4->headFrame).framePointer = (this->stackFrame).framePointer;
  (pSVar4->headFrame).stackPointer = puVar5;
  this->currentPage->baseFramePointer = (this->stackFrame).framePointer;
  StackFrame::ensureHasUpdatedMarriedSpouse(&local_38,this->context);
  StackFrame::ensureHasUpdatedMarriedSpouse(&this->stackFrame,this->context);
  puVar3 = *(undefined8 **)(local_38.framePointer + -0x18);
  *(undefined8 **)(*(long *)((this->stackFrame).framePointer + -0x18) + 8) = puVar3;
  if (puVar3 != &NilObject) {
    return;
  }
  __assert_fail("!currentContext->sender.isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x101,"void Lodtalk::StackMemory::stackOverflow()");
}

Assistant:

void StackMemory::stackOverflow()
{
    // Store the previous frame
    auto previousFrame = stackFrame.getPreviousFrame();
    currentPage->headFrame = previousFrame;

    // Allocate and link the next page.
    auto nextPage = allocatePage();
    assert(nextPage != currentPage);
    nextPage->startUsing();
    currentPage->nextPage = nextPage;
    nextPage->previousPage = currentPage;

    // Get the source pointers and size
    auto srcBeginCopy = stackFrame.getBeginPointer();
    auto srcEndCopy = stackFrame.getEndPointer();
    auto copySize = srcEndCopy - srcBeginCopy;
    auto framePointerOffset = stackFrame.framePointer - srcBeginCopy;

    // Get the destination pointers
    auto dstEndCopy = nextPage->baseFramePointer;
    auto dstBeginCopy = dstEndCopy - copySize;

    // Copy the stack frame
    memcpy(dstBeginCopy, srcBeginCopy, copySize);

    // Use the new stack page
    auto newFramePointer = dstBeginCopy + framePointerOffset;
    stackFrame = StackFrame(newFramePointer, dstBeginCopy);
    stackFrame.setPrevFramePointer(nullptr);
    currentPage = nextPage;
    currentPage->headFrame = stackFrame;
    currentPage->baseFramePointer = stackFrame.framePointer;

    // Make sure they have contexts.
    previousFrame.ensureHasUpdatedMarriedSpouse(context);
    stackFrame.ensureHasUpdatedMarriedSpouse(context);

    // Link the new context with the previous context
    auto currentContext = reinterpret_cast<Context*> (stackFrame.getThisContext().pointer);
    currentContext->sender = previousFrame.getThisContext();
    assert(!currentContext->sender.isNil());
}